

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O2

void __thiscall
slang::syntax::IntersectClauseSyntax::setChild
          (IntersectClauseSyntax *this,size_t index,TokenOrSyntax child)

{
  SyntaxNode *pSVar1;
  RangeListSyntax *pRVar2;
  Token TVar3;
  
  if (index == 0) {
    TVar3 = ConstTokenOrSyntax::token(&child.super_ConstTokenOrSyntax);
    (this->intersect).kind = TVar3.kind;
    (this->intersect).field_0x2 = TVar3._2_1_;
    (this->intersect).numFlags = (NumericTokenFlags)TVar3.numFlags.raw;
    (this->intersect).rawLen = TVar3.rawLen;
    (this->intersect).info = TVar3.info;
  }
  else {
    pSVar1 = TokenOrSyntax::node(&child);
    if (pSVar1 == (SyntaxNode *)0x0) {
      pRVar2 = (RangeListSyntax *)0x0;
    }
    else {
      pRVar2 = (RangeListSyntax *)TokenOrSyntax::node(&child);
    }
    (this->ranges).ptr = pRVar2;
  }
  return;
}

Assistant:

void IntersectClauseSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: intersect = child.token(); return;
        case 1: ranges = child.node() ? &child.node()->as<RangeListSyntax>() : nullptr; return;
        default: SLANG_UNREACHABLE;
    }
}